

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_setupvalt(lua_State *L,LClosure *cl,TValue *ra,int b)

{
  UpVal *pUVar1;
  Value *pVVar2;
  TValue *io2;
  TValue *io1;
  UpVal *uv;
  int b_local;
  TValue *ra_local;
  LClosure *cl_local;
  lua_State *L_local;
  
  if (ra->tt_ != 0x8005) {
    luaG_runerror(L,"upvalue of table type, cannot be set to non table value");
  }
  pUVar1 = cl->upvals[b];
  pVVar2 = &pUVar1->v->value_;
  *pVVar2 = ra->value_;
  *(LuaType *)(pVVar2 + 1) = ra->tt_;
  if (((ulong)pVVar2[1] & 0x8000) != 0) {
    if (((ulong)pVVar2[1] & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xbd1,"void raviV_op_setupvalt(lua_State *, LClosure *, TValue *, int)");
    }
    if ((*(ushort *)(pVVar2 + 1) & 0x7f) != (ushort)pVVar2->gc->tt) {
LAB_00164ee0:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xbd1,"void raviV_op_setupvalt(lua_State *, LClosure *, TValue *, int)");
    }
    if (L != (lua_State *)0x0) {
      if (((ulong)pVVar2[1] & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xbd1,"void raviV_op_setupvalt(lua_State *, LClosure *, TValue *, int)");
      }
      if ((pVVar2->gc->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00164ee0;
    }
  }
  if (((ra->tt_ & 0x8000) != 0) && (pUVar1->v == (TValue *)&pUVar1->u)) {
    if ((ra->tt_ & 0x8000) == 0) {
      __assert_fail("(((ra)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xbd2,"void raviV_op_setupvalt(lua_State *, LClosure *, TValue *, int)");
    }
    luaC_upvalbarrier_(L,(ra->value_).gc);
  }
  return;
}

Assistant:

void raviV_op_setupvalt(lua_State *L, LClosure *cl, TValue *ra, int b) {
  if (!ttisLtable(ra))
    luaG_runerror(L, "upvalue of table type, cannot be set to non table value");
  UpVal *uv = cl->upvals[b];
  setobj(L, uv->v, ra);
  luaC_upvalbarrier(L, uv, ra);
}